

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O0

void __thiscall QRhiWidget::resizeEvent(QRhiWidget *this,QResizeEvent *e)

{
  bool bVar1;
  QRhiWidgetPrivate *this_00;
  QSize this_01;
  QSize *in_RSI;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  QRhiWidgetPrivate *d;
  QRhiWidgetPrivate *this_02;
  QPoint *atopLeft;
  undefined1 local_20 [16];
  QRegion local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  atopLeft = in_RDI;
  this_00 = d_func((QRhiWidget *)0x347c7f);
  QResizeEvent::size((QResizeEvent *)in_RSI);
  bVar1 = QSize::isEmpty(in_RSI);
  if (bVar1) {
    this_00->noSize = true;
  }
  else {
    this_00->noSize = false;
    this_02 = this_00;
    QPoint::QPoint(in_RDI,(int)((ulong)this_00 >> 0x20),(int)this_00);
    this_01 = QWidget::size((QWidget *)this_00);
    QRect::QRect((QRect *)this_01,atopLeft,in_RSI);
    QRegion::QRegion(&local_10,(QRect *)local_20,Rectangle);
    QWidgetPrivate::sendPaintEvent(&this_02->super_QWidgetPrivate,(QRegion *)in_RDI);
    QRegion::~QRegion(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRhiWidget::resizeEvent(QResizeEvent *e)
{
    Q_D(QRhiWidget);

    if (e->size().isEmpty()) {
        d->noSize = true;
        return;
    }
    d->noSize = false;

    d->sendPaintEvent(QRect(QPoint(0, 0), size()));
}